

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# convolution.cpp
# Opt level: O0

Layer * ncnn::Convolution_layer_creator(void)

{
  Layer *pLVar1;
  Convolution *in_stack_00000010;
  
  pLVar1 = (Layer *)operator_new(0x230);
  Convolution::Convolution(in_stack_00000010);
  return pLVar1;
}

Assistant:

Convolution::Convolution()
{
    one_blob_only = true;
    support_inplace = false;
    use_int8_requantize = false;

    quantize = 0;
}